

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.cpp
# Opt level: O3

int64_t celero::GetRAMSystemTotal(void)

{
  sysinfo memInfo;
  sysinfo sStack_78;
  
  sysinfo(&sStack_78);
  return (ulong)sStack_78.mem_unit *
         (sStack_78.totalswap + sStack_78.totalram + sStack_78.totalhigh);
}

Assistant:

int64_t celero::GetRAMSystemTotal()
{
#ifdef _WIN32
	MEMORYSTATUSEX memInfo;
	memInfo.dwLength = sizeof(MEMORYSTATUSEX);
	GlobalMemoryStatusEx(&memInfo);
	return static_cast<int64_t>(memInfo.ullTotalPhys) + static_cast<int64_t>(memInfo.ullTotalVirtual);
#elif defined(__unix__) || defined(__unix) || defined(unix)
	// Prefer sysctl() over sysconf() except sysctl() HW_REALMEM and HW_PHYSMEM
	// return static_cast<int64_t>(sysconf(_SC_PHYS_PAGES)) * static_cast<int64_t>(sysconf(_SC_PAGE_SIZE));
	struct sysinfo memInfo;
	sysinfo(&memInfo);
	int64_t total = memInfo.totalram;
	total += memInfo.totalswap;
	total += memInfo.totalhigh;
	return total * static_cast<int64_t>(memInfo.mem_unit);
#elif defined(__APPLE__)
	int mib[2];
	mib[0] = CTL_HW;
	mib[1] = HW_MEMSIZE;

	int64_t memInfo{0};
	auto len = sizeof(memInfo);

	if(sysctl(mib, 2, &memInfo, &len, nullptr, 0) == 0)
	{
		return memInfo;
	}

	return -1;
#else
	return -1;
#endif
}